

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modes.c
# Opt level: O0

int set_default_mode(int f,int n)

{
  int iVar1;
  char *pcVar2;
  maps_s *pmVar3;
  bool bVar4;
  char *bufp;
  char modebuf [32];
  maps_s *m;
  int i;
  int n_local;
  int f_local;
  
  pcVar2 = eread("Set Default Mode: ",(char *)&bufp,0x20,8);
  if (pcVar2 == (char *)0x0) {
    n_local = 2;
  }
  else if (*pcVar2 == '\0') {
    n_local = 0;
  }
  else {
    pmVar3 = name_mode((char *)&bufp);
    if (pmVar3 == (maps_s *)0x0) {
      dobeep();
      ewprintf("can\'t find mode %s",&bufp);
      n_local = 0;
    }
    else {
      m._4_4_ = n;
      if ((f & 7U) == 0) {
        for (m._0_4_ = 0; (int)m <= defb_nmodes; m._0_4_ = (int)m + 1) {
          if (defb_modes[(int)m] == pmVar3) {
            m._4_4_ = 0;
            break;
          }
        }
      }
      if (m._4_4_ < 1) {
        m._0_4_ = 1;
        while( true ) {
          bVar4 = false;
          if ((int)m <= defb_nmodes) {
            bVar4 = pmVar3 != defb_modes[(int)m];
          }
          if (!bVar4) break;
          m._0_4_ = (int)m + 1;
        }
        if (defb_nmodes < (int)m) {
          return 1;
        }
        for (; (int)m < defb_nmodes; m._0_4_ = (int)m + 1) {
          defb_modes[(int)m] = defb_modes[(int)m + 1];
        }
        defb_nmodes = defb_nmodes + -1;
      }
      else {
        for (m._0_4_ = 0; (int)m <= defb_nmodes; m._0_4_ = (int)m + 1) {
          if (defb_modes[(int)m] == pmVar3) {
            return 1;
          }
        }
        if (2 < defb_nmodes) {
          dobeep();
          ewprintf("Too many modes");
          return 0;
        }
        defb_nmodes = defb_nmodes + 1;
        defb_modes[defb_nmodes] = pmVar3;
      }
      iVar1 = strcmp((char *)&bufp,"overwrite");
      if (iVar1 == 0) {
        if (m._4_4_ < 1) {
          defb_flag = defb_flag & 0xfffffff7;
        }
        else {
          defb_flag = defb_flag | 8;
        }
      }
      iVar1 = strcmp((char *)&bufp,"notab");
      if (iVar1 == 0) {
        if (m._4_4_ < 1) {
          defb_flag = defb_flag & 0xfffffffb;
        }
        else {
          defb_flag = defb_flag | 4;
        }
      }
      n_local = 1;
    }
  }
  return n_local;
}

Assistant:

int
set_default_mode(int f, int n)
{
	int	 i;
	struct maps_s	*m;
	char	 modebuf[32], *bufp;

	if ((bufp = eread("Set Default Mode: ", modebuf, sizeof(modebuf),
	    EFNEW)) == NULL)
		return (ABORT);
	else if (bufp[0] == '\0')
		return (FALSE);
	if ((m = name_mode(modebuf)) == NULL) {
		dobeep();
		ewprintf("can't find mode %s", modebuf);
		return (FALSE);
	}
	if (!(f & FFARG)) {
		for (i = 0; i <= defb_nmodes; i++)
			if (defb_modes[i] == m) {
				/* mode already set */
				n = 0;
				break;
			}
	}
	if (n > 0) {
		for (i = 0; i <= defb_nmodes; i++)
			if (defb_modes[i] == m)
				/* mode already set */
				return (TRUE);
		if (defb_nmodes >= PBMODES - 1) {
			dobeep();
			ewprintf("Too many modes");
			return (FALSE);
		}
		defb_modes[++defb_nmodes] = m;
	} else {
		/* fundamental is defb_modes[0] and can't be unset */
		for (i = 1; i <= defb_nmodes && m != defb_modes[i]; i++);
		if (i > defb_nmodes)
			/* mode was not set */
			return (TRUE);
		for (; i < defb_nmodes; i++)
			defb_modes[i] = defb_modes[i + 1];
		defb_nmodes--;
	}
	if (strcmp(modebuf, "overwrite") == 0) {
		if (n <= 0)
			defb_flag &= ~BFOVERWRITE;
		else
			defb_flag |= BFOVERWRITE;
	}
	if (strcmp(modebuf, "notab") == 0) {
		if (n <= 0)
			defb_flag &= ~BFNOTAB;
		else
			defb_flag |= BFNOTAB;
	}
	return (TRUE);
}